

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getExtractionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  byte bVar1;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var2;
  string *psVar3;
  
  p_Var2 = getHandleInfo(this,handle);
  psVar3 = (string *)&gEmptyString_abi_cxx11_;
  if (p_Var2 != (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    bVar1 = (p_Var2->
            super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
            ._M_storage._M_storage.__data[4];
    if (bVar1 < 0x69) {
      if (bVar1 != 0x65) {
        if (bVar1 != 0x66) {
          return (string *)&gEmptyString_abi_cxx11_;
        }
        return (string *)p_Var2[3].super__Hash_node_base._M_nxt;
      }
    }
    else if ((bVar1 != 0x70) && (bVar1 != 0x69)) {
      return (string *)&gEmptyString_abi_cxx11_;
    }
    psVar3 = (string *)
             &p_Var2[1].
              super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
    ;
  }
  return psVar3;
}

Assistant:

const std::string& CommonCore::getExtractionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::PUBLICATION:
            case InterfaceType::INPUT:
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_out;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}